

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord3f> *value)

{
  bool bVar1;
  undefined1 local_30 [8];
  texcoord3f v;
  optional<tinyusdz::value::texcoord3f> *value_local;
  AsciiParser *this_local;
  
  unique0x10000064 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::operator=(stack0xffffffffffffffe0)
    ;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(texcoord3f *)local_30);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::operator=
                (stack0xffffffffffffffe0,(texcoord3f *)local_30);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}